

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O3

void __thiscall
cmDocumentationFormatter::PrintSection
          (cmDocumentationFormatter *this,ostream *os,cmDocumentationSection *section)

{
  pointer pcVar1;
  ostream *poVar2;
  size_t sVar3;
  char *pcVar4;
  pointer pcVar5;
  int iVar6;
  size_type sVar7;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pcVar1 = (section->Name)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (section->Name)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pcVar5 = (section->Entries).
           super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar5 != (section->Entries).
                super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    do {
      if ((pcVar5->Name)._M_string_length == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        this->TextIndent = "";
        PrintFormatted(this,os,(pcVar5->Brief)._M_dataplus._M_p);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,(pcVar5->Name)._M_dataplus._M_p,(pcVar5->Name)._M_string_length);
        pcVar4 = "                                 ";
        this->TextIndent = "                                 ";
        sVar7 = (pcVar5->Name)._M_string_length;
        if ((int)sVar7 < 0x1d) {
          iVar6 = (int)sVar7 + -0x1d;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            iVar6 = iVar6 + 1;
          } while (iVar6 != 0);
          sVar7 = (pcVar5->Name)._M_string_length;
          pcVar4 = this->TextIndent;
        }
        sVar3 = strlen(pcVar4);
        if (sVar3 - 4 < sVar7) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
          pcVar4 = this->TextIndent;
          strlen(pcVar4);
          std::ostream::write((char *)os,(long)pcVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"= ",2);
        PrintColumn(this,os,(pcVar5->Brief)._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      }
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 != (section->Entries).
                       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

void cmDocumentationFormatter::PrintSection(
  std::ostream& os, cmDocumentationSection const& section)
{
  os << section.GetName() << "\n";

  const std::vector<cmDocumentationEntry>& entries = section.GetEntries();
  for (std::vector<cmDocumentationEntry>::const_iterator op = entries.begin();
       op != entries.end(); ++op) {
    if (!op->Name.empty()) {
      os << "  " << op->Name;
      this->TextIndent = "                                 ";
      int align = static_cast<int>(strlen(this->TextIndent)) - 4;
      for (int i = static_cast<int>(op->Name.size()); i < align; ++i) {
        os << " ";
      }
      if (op->Name.size() > strlen(this->TextIndent) - 4) {
        os << "\n";
        os.write(this->TextIndent, strlen(this->TextIndent) - 2);
      }
      os << "= ";
      this->PrintColumn(os, op->Brief.c_str());
      os << "\n";
    } else {
      os << "\n";
      this->TextIndent = "";
      this->PrintFormatted(os, op->Brief.c_str());
    }
  }
  os << "\n";
}